

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O2

void __thiscall Cleaner::RemoveEdgeFiles(Cleaner *this,Edge *edge)

{
  string rspfile;
  string depfile;
  string sStack_58;
  string local_38;
  
  Edge::GetUnescapedDepfile_abi_cxx11_(&local_38,edge);
  if (local_38._M_string_length != 0) {
    Remove(this,&local_38);
  }
  Edge::GetUnescapedRspfile_abi_cxx11_(&sStack_58,edge);
  if (sStack_58._M_string_length != 0) {
    Remove(this,&sStack_58);
  }
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Cleaner::RemoveEdgeFiles(Edge* edge) {
  string depfile = edge->GetUnescapedDepfile();
  if (!depfile.empty())
    Remove(depfile);

  string rspfile = edge->GetUnescapedRspfile();
  if (!rspfile.empty())
    Remove(rspfile);
}